

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O0

void indent(buffer *b,size_t amount)

{
  long lVar1;
  undefined8 uStack_50;
  undefined1 auStack_48 [8];
  undefined1 *local_40;
  ulong local_38;
  size_t i;
  unsigned_long __vla_expr0;
  ulong local_20;
  size_t spaces;
  size_t amount_local;
  buffer *b_local;
  
  __vla_expr0 = (unsigned_long)auStack_48;
  local_20 = amount * 4;
  i = local_20 + 1;
  lVar1 = -(local_20 + 0x10 & 0xfffffffffffffff0);
  local_40 = auStack_48 + lVar1;
  for (local_38 = 0; local_38 < local_20; local_38 = local_38 + 1) {
    local_40[local_38] = 0x20;
  }
  local_40[local_20] = 0;
  spaces = amount;
  amount_local = (size_t)b;
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x104910;
  bprintf(b,"%s");
  return;
}

Assistant:

static void indent(struct buffer* b, size_t amount)
{
    size_t spaces = amount * 4; /* 4 spaces per indent */

    char temp[spaces + 1];

    for(size_t i = 0; i < spaces; ++i)
        temp[i] = ' ';
    temp[spaces] = '\0';

    bprintf(b, "%s", temp);
}